

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O2

void __thiscall tt::net::Epoll::epoll_mod(Epoll *this,SP_Channel *request,int timeout)

{
  __uint32_t _Var1;
  element_type *peVar2;
  int __fd;
  int iVar3;
  undefined1 local_44 [8];
  epoll_event event;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (0 < timeout) {
    std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2> *)&event.data,
               &request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
    add_timer(this,(SP_Channel *)&event.data,timeout);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  __fd = Channel::getFd((request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
  peVar2 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_44._0_4_ = peVar2->m_events;
  _Var1 = peVar2->m_lastEvents;
  peVar2->m_lastEvents = local_44._0_4_;
  if (_Var1 != local_44._0_4_) {
    local_44._4_4_ = __fd;
    iVar3 = epoll_ctl(this->m_epollFd,3,__fd,(epoll_event *)local_44);
    if (iVar3 < 0) {
      perror("epoll_mod error");
      std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
                (&this->m_fd2chan[__fd].
                  super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

void Epoll::epoll_mod(SP_Channel request, int timeout){
	
	if(timeout > 0) add_timer(request,timeout);

	int fd = request->getFd();
	if(!request->EqualAndUpdateLastEvents()){
		struct epoll_event event;

		event.data.fd = fd;
		event.events = request->getEvents();
		if(epoll_ctl(m_epollFd, EPOLL_CTL_MOD, fd, &event) < 0){
			perror("epoll_mod error");

			m_fd2chan[fd].reset();
		}
	
	}
}